

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

void ipc_on_connection_tcp_conn(uv_stream_t *server,int status)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  uv_tcp_t *conn;
  uv_buf_t buf;
  int r;
  int status_local;
  uv_stream_t *server_local;
  
  buf.len._4_4_ = status;
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2b8,"status == 0");
    abort();
  }
  if (server != (uv_stream_t *)&tcp_server) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2b9,"(uv_stream_t*)&tcp_server == server");
    abort();
  }
  pvVar1 = malloc(0xf8);
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,700,"conn");
    abort();
  }
  buf.len._0_4_ = uv_tcp_init(tcp_server.loop,pvVar1);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2bf,"r == 0");
    abort();
  }
  buf.len._0_4_ = uv_accept(&tcp_server,pvVar1);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2c2,"r == 0");
    abort();
  }
  auVar2 = uv_buf_init("hello\n",6);
  buf.base = auVar2._8_8_;
  conn = auVar2._0_8_;
  buf.len._0_4_ = uv_write2(&conn_notify_req,&channel,&conn,1,pvVar1,0);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2c8,"r == 0");
    abort();
  }
  buf.len._0_4_ = uv_read_start(pvVar1,on_read_alloc,on_tcp_child_process_read);
  if ((int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x2cd,"r == 0");
    abort();
  }
  uv_close(pvVar1,close_cb);
  return;
}

Assistant:

static void ipc_on_connection_tcp_conn(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;
  uv_tcp_t* conn;

  ASSERT(status == 0);
  ASSERT((uv_stream_t*)&tcp_server == server);

  conn = malloc(sizeof(*conn));
  ASSERT(conn);

  r = uv_tcp_init(server->loop, conn);
  ASSERT(r == 0);

  r = uv_accept(server, (uv_stream_t*)conn);
  ASSERT(r == 0);

  /* Send the accepted connection to the other process */
  buf = uv_buf_init("hello\n", 6);
  r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
    (uv_stream_t*)conn, NULL);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) conn,
                    on_read_alloc,
                    on_tcp_child_process_read);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)conn, close_cb);
}